

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O2

UBool arrayEqual(void *a1,void *a2,int32_t size)

{
  UBool UVar1;
  int iVar2;
  
  UVar1 = '\x01';
  if (a1 != (void *)0x0 || a2 != (void *)0x0) {
    if ((a2 != (void *)0x0) == (a1 != (void *)0x0)) {
      if (a1 != a2) {
        iVar2 = bcmp(a1,a2,(long)size);
        return iVar2 == 0;
      }
    }
    else {
      UVar1 = '\0';
    }
  }
  return UVar1;
}

Assistant:

static UBool arrayEqual(const void *a1, const void *a2, int32_t size) {
    if (a1 == NULL && a2 == NULL) {
        return TRUE;
    }
    if ((a1 != NULL && a2 == NULL) || (a1 == NULL && a2 != NULL)) {
        return FALSE;
    }
    if (a1 == a2) {
        return TRUE;
    }

    return (uprv_memcmp(a1, a2, size) == 0);
}